

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O3

char __thiscall YAML::Stream::get(Stream *this)

{
  int *piVar1;
  char cVar2;
  
  cVar2 = peek(this);
  AdvanceCurrent(this);
  piVar1 = &(this->m_mark).column;
  *piVar1 = *piVar1 + 1;
  if (cVar2 == '\n') {
    (this->m_mark).column = 0;
    piVar1 = &(this->m_mark).line;
    *piVar1 = *piVar1 + 1;
  }
  return cVar2;
}

Assistant:

char Stream::get() {
  char ch = peek();
  AdvanceCurrent();
  m_mark.column++;

  if (ch == '\n') {
    m_mark.column = 0;
    m_mark.line++;
  }

  return ch;
}